

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O0

void __thiscall
ctemplate::PrefixLine::Modify
          (PrefixLine *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  void *pvVar1;
  void *local_68;
  PerExpandData *local_60;
  long local_50;
  size_t linelen;
  char *cr;
  char *nl;
  string *arg_local;
  ExpandEmitter *out_local;
  PerExpandData *param_3_local;
  size_t inlen_local;
  char *in_local;
  PrefixLine *this_local;
  
  param_3_local = (PerExpandData *)inlen;
  inlen_local = (size_t)in;
  while( true ) {
    if (param_3_local == (PerExpandData *)0x0) {
      return;
    }
    pvVar1 = memchr((void *)inlen_local,10,(size_t)param_3_local);
    if (pvVar1 == (void *)0x0) {
      local_60 = param_3_local;
    }
    else {
      local_60 = (PerExpandData *)((long)pvVar1 - inlen_local);
    }
    local_68 = memchr((void *)inlen_local,0xd,(size_t)local_60);
    if ((pvVar1 == (void *)0x0) && (local_68 == (void *)0x0)) break;
    if ((pvVar1 == (void *)0x0) == (local_68 == (void *)0x0)) {
      if ((pvVar1 == (void *)((long)local_68 + 1)) || (pvVar1 < local_68)) {
        local_50 = (long)pvVar1 + (1 - inlen_local);
      }
      else {
        local_50 = (long)local_68 + (1 - inlen_local);
      }
    }
    else {
      if (pvVar1 != (void *)0x0) {
        local_68 = pvVar1;
      }
      local_50 = (long)local_68 + (1 - inlen_local);
    }
    (*out->_vptr_ExpandEmitter[5])(out,inlen_local,local_50);
    (*out->_vptr_ExpandEmitter[3])(out,arg);
    inlen_local = local_50 + inlen_local;
    param_3_local = (PerExpandData *)((long)param_3_local - local_50);
  }
  (*out->_vptr_ExpandEmitter[5])(out,inlen_local,param_3_local);
  return;
}

Assistant:

void PrefixLine::Modify(const char* in, size_t inlen,
                        const PerExpandData*,
                        ExpandEmitter* out, const string& arg) const {
  while (inlen > 0) {
    const char* nl = (const char*)memchr(in, '\n', inlen);
    const char* cr = (const char*)memchr(in, '\r', nl ? nl - in : inlen);
    size_t linelen;
    if (nl == NULL && cr == NULL) {
      // We're at the last line
      out->Emit(in, inlen);
      break;
    } else {
      // One or both of \r and \n is set; point to the first char past
      // the newline.  Note for \r\n, that's the char after the \n,
      // otherwise, it's the char past the \r or the \n we see.
      if ((nl == NULL) != (cr == NULL))     // one is set, the other is NULL
        linelen = (nl ? nl : cr) + 1 - in;
      else if (nl == cr + 1 || nl < cr)     // \r\n, or \n comes first
        linelen = nl + 1 - in;
      else
        linelen = cr + 1 - in;
    }
    out->Emit(in, linelen);
    out->Emit(arg);               // a new line, so emit the prefix
    in += linelen;
    inlen -= linelen;
    assert(inlen >= 0);
  }
}